

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  _List_node_base *p_Var3;
  iterator iVar4;
  iterator DotToken;
  iterator local_38;
  
  local_38._M_node = (_List_node_base *)CONCAT44(in_register_00000004,in_EAX);
  iVar4 = (iterator)ScopeStart->_M_node;
  if (ScopeEnd->_M_node != iVar4._M_node) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)&iVar4._M_node[1]._M_prev);
      p_Var3 = iVar4._M_node;
      if (iVar2 == 0) {
        p_Var3 = (iVar4._M_node)->_M_next;
        if (p_Var3 == ScopeEnd->_M_node) {
          return;
        }
        local_38._M_node = iVar4._M_node;
        if (*(int *)&p_Var3[1]._M_next != 0x13b) goto LAB_002cd397;
        bVar1 = ProcessObjectMethod(this,&local_38,ScopeStart,ScopeEnd);
        iVar4._M_node = p_Var3;
        if (bVar1) {
          iVar4._M_node = local_38._M_node;
        }
      }
      else {
LAB_002cd397:
        iVar4._M_node = p_Var3->_M_next;
      }
    } while (iVar4._M_node != ScopeEnd->_M_node);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods(const TokenListType::iterator& ScopeStart,
                                                                    const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        // Search for .identifier pattern

        if (Token->Literal == ".")
        {
            auto DotToken = Token;
            ++Token;
            if (Token == ScopeEnd)
                break;
            if (Token->Type == TokenType::Identifier)
            {
                if (ProcessObjectMethod(DotToken, ScopeStart, ScopeEnd))
                    Token = DotToken;
            }
            else
            {
                ++Token;
                continue;
            }
        }
        else
            ++Token;
    }
}